

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O1

void PrefixAttacher(ostream *s,LogMessageInfo *l,void *data)

{
  _func_int *p_Var1;
  char *__s;
  code cVar2;
  int iVar3;
  undefined8 in_RAX;
  ostream *poVar4;
  long *plVar5;
  size_t sVar6;
  undefined8 uStack_28;
  
  if ((data != (void *)0x0) &&
     (uStack_28 = in_RAX, iVar3 = std::__cxx11::string::compare((char *)data), iVar3 == 0)) {
    uStack_28._0_2_ = CONCAT11(*l->severity,(undefined1)uStack_28);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(s,(char *)((long)&uStack_28 + 1),1);
    *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 4;
    plVar5 = (long *)std::ostream::operator<<(poVar4,(l->time->tm_).tm_year + 0x76c);
    *(undefined8 *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x10) = 2;
    plVar5 = (long *)std::ostream::operator<<(plVar5,(l->time->tm_).tm_mon + 1);
    *(undefined8 *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x10) = 2;
    poVar4 = (ostream *)std::ostream::operator<<(plVar5,(l->time->tm_).tm_mday);
    uStack_28._0_3_ = CONCAT12(0x20,(undefined2)uStack_28);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)((long)&uStack_28 + 2),1);
    *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 2;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(l->time->tm_).tm_hour);
    uStack_28._0_4_ = CONCAT13(0x3a,(undefined3)uStack_28);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)((long)&uStack_28 + 3),1);
    *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 2;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(l->time->tm_).tm_min);
    uStack_28._0_5_ = CONCAT14(0x3a,(undefined4)uStack_28);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)((long)&uStack_28 + 4),1);
    *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 2;
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(l->time->tm_).tm_sec);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
    *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 6;
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    uStack_28._0_6_ = CONCAT15(0x20,(undefined5)uStack_28);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)((long)&uStack_28 + 5),1);
    p_Var1 = (_func_int *)
             ((long)&poVar4->_vptr_basic_ostream + (long)poVar4->_vptr_basic_ostream[-3]);
    if ((&poVar4->field_0xe1)[(long)poVar4->_vptr_basic_ostream[-3]] == '\0') {
      cVar2 = (code)std::ios::widen((char)p_Var1);
      p_Var1[0xe0] = cVar2;
      p_Var1[0xe1] = (code)0x1;
    }
    p_Var1[0xe0] = (code)0x20;
    *(undefined8 *)(&poVar4->field_0x10 + (long)poVar4->_vptr_basic_ostream[-3]) = 5;
    if ((l->thread_id)._M_thread == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"thread::id of a non-executing thread",0x24);
    }
    else {
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    }
    p_Var1 = (_func_int *)
             ((long)&poVar4->_vptr_basic_ostream + (long)poVar4->_vptr_basic_ostream[-3]);
    if ((&poVar4->field_0xe1)[(long)poVar4->_vptr_basic_ostream[-3]] == '\0') {
      cVar2 = (code)std::ios::widen((char)p_Var1);
      p_Var1[0xe0] = cVar2;
      p_Var1[0xe1] = (code)0x1;
    }
    p_Var1[0xe0] = (code)0x30;
    uStack_28._0_7_ = CONCAT16(0x20,(undefined6)uStack_28);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)((long)&uStack_28 + 6),1);
    __s = l->filename;
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
    }
    else {
      sVar6 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar6);
    }
    uStack_28 = CONCAT17(0x3a,(undefined7)uStack_28);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)((long)&uStack_28 + 7),1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*l->line_number);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
  }
  return;
}

Assistant:

void PrefixAttacher(std::ostream& s, const LogMessageInfo& l, void* data) {
  // Assert that `data` contains the expected contents before producing the
  // prefix (otherwise causing the tests to fail):
  if (data == nullptr || *static_cast<string*>(data) != "good data") {
    return;
  }

  s << l.severity[0] << setw(4) << 1900 + l.time.year() << setw(2)
    << 1 + l.time.month() << setw(2) << l.time.day() << ' ' << setw(2)
    << l.time.hour() << ':' << setw(2) << l.time.min() << ':' << setw(2)
    << l.time.sec() << "." << setw(6) << l.time.usec() << ' ' << setfill(' ')
    << setw(5) << l.thread_id << setfill('0') << ' ' << l.filename << ':'
    << l.line_number << "]";
}